

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WaitOrderStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WaitOrderStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::syntax::ActionBlockSyntax&>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *args_4,Token *args_5,
          ActionBlockSyntax *args_6)

{
  Token closeParen;
  Token wait_order;
  Token openParen;
  WaitOrderStatementSyntax *pWVar1;
  undefined8 *in_RCX;
  Info *in_RDX;
  Info *unaff_RBX;
  undefined8 in_RDI;
  WaitOrderStatementSyntax *in_R8;
  NamedLabelSyntax *in_R9;
  undefined8 unaff_retaddr;
  Info *in_stack_00000008;
  ActionBlockSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  BumpAllocator *in_stack_ffffffffffffff88;
  
  pWVar1 = (WaitOrderStatementSyntax *)
           allocate(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  wait_order.info = in_RDX;
  wait_order._0_8_ = in_RCX;
  openParen.info = unaff_RBX;
  openParen.kind = (short)in_RDI;
  openParen._2_1_ = (char)((ulong)in_RDI >> 0x10);
  openParen.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  openParen.rawLen = (int)((ulong)in_RDI >> 0x20);
  closeParen.info = in_stack_00000008;
  closeParen.kind = (short)unaff_retaddr;
  closeParen._2_1_ = (char)((ulong)unaff_retaddr >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)unaff_retaddr >> 0x18);
  closeParen.rawLen = (int)((ulong)unaff_retaddr >> 0x20);
  slang::syntax::WaitOrderStatementSyntax::WaitOrderStatementSyntax
            (in_R8,in_R9,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RCX[1],wait_order,
             openParen,(SeparatedSyntaxList<slang::syntax::NameSyntax> *)*in_RCX,closeParen,
             in_stack_00000010);
  return pWVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }